

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDFaceParameter * __thiscall
ON_SubDMeshFragment::VertexSubDFaceParameter
          (ON_SubDFaceParameter *__return_storage_ptr__,ON_SubDMeshFragment *this,
          uint grid_point_index)

{
  undefined4 uVar1;
  double dVar2;
  ON_2udex OVar3;
  
  if (grid_point_index < (this->m_vertex_count_etc & 0x1fff)) {
    OVar3 = ON_SubDMeshFragmentGrid::Grid2dexFromPointIndex(&this->m_grid,grid_point_index);
    VertexSubDFaceParameter(__return_storage_ptr__,this,OVar3.i,OVar3.j);
  }
  else {
    __return_storage_ptr__->m_t = ON_SubDFaceParameter::Nan.m_t;
    dVar2 = ON_SubDFaceParameter::Nan.m_s;
    uVar1 = ON_SubDFaceParameter::Nan._4_4_;
    __return_storage_ptr__->m_cdex = ON_SubDFaceParameter::Nan.m_cdex;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar1;
    __return_storage_ptr__->m_s = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDFaceParameter ON_SubDMeshFragment::VertexSubDFaceParameter(
  unsigned grid_point_index
) const
{
  return
    (grid_point_index < VertexCount())
    ? VertexSubDFaceParameter(m_grid.Grid2dexFromPointIndex(grid_point_index))
    : ON_SubDFaceParameter::Nan;
}